

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O2

void SoPlex_addColReal(void *soplex,double *colentries,int colsize,int nnonzeros,double objval,
                      double lb,double ub)

{
  ulong uVar1;
  ulong uVar2;
  DSVector col;
  DSVectorBase<double> local_80;
  LPColBase<double> local_60;
  
  ::soplex::DSVectorBase<double>::DSVectorBase(&local_80,nnonzeros);
  uVar1 = 0;
  uVar2 = (ulong)(uint)colsize;
  if (colsize < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    if ((*colentries != 0.0) || (NAN(*colentries))) {
      ::soplex::DSVectorBase<double>::add(&local_80,(int)uVar1,colentries);
    }
    colentries = colentries + 1;
  }
  local_60.up = ub;
  local_60.low = lb;
  local_60.object = objval;
  ::soplex::DSVectorBase<double>::DSVectorBase<double>
            (&local_60.vec,&local_80.super_SVectorBase<double>);
  ::soplex::SoPlexBase<double>::addColReal((SoPlexBase<double> *)soplex,&local_60);
  ::soplex::DSVectorBase<double>::~DSVectorBase(&local_60.vec);
  ::soplex::DSVectorBase<double>::~DSVectorBase(&local_80);
  return;
}

Assistant:

void SoPlex_addColReal(void* soplex, double* colentries, int colsize, int nnonzeros, double objval,
                       double lb, double ub)
{
   SoPlex* so = (SoPlex*)(soplex);
   DSVector col(nnonzeros);

   /* add nonzero entries to column vector */
   for(int i = 0; i < colsize; ++i)
   {
      if(colentries[i] != 0.0)
         col.add(i, colentries[i]);
   }

   so->addColReal(LPCol(objval, col, ub, lb));
}